

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *stream;
  
  if (argc == 2) {
    stream = fopen(argv[1],"r");
    if (stream != (FILE *)0x0) {
      printf("Dump of object file \"%s\"\n",argv[1]);
      dump((FILE *)stream);
      exit(1);
    }
    fprintf(_stderr,"can\'t open object file %s\n",argv[1]);
  }
  else {
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
	FILE* stream;

	if (argc != 2)
	{
		usage();
		exit(0);
	}

	stream = fopen(argv[1], "r");
	if (stream == NULL)
	{
		fprintf(stderr, "can't open object file %s\n", argv[1]);
		exit(0);
	}

	printf("Dump of object file \"%s\"\n", argv[1]);
	dump(stream);
	exit(1);
}